

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

rnndecaddrinfo * rnndec_decodeaddr(rnndeccontext *ctx,rnndomain *domain,uint64_t addr,int write)

{
  rnndecaddrinfo *res;
  int write_local;
  uint64_t addr_local;
  rnndomain *domain_local;
  rnndeccontext *ctx_local;
  
  ctx_local = (rnndeccontext *)
              trymatch(ctx,domain->subelems,domain->subelemsnum,addr,write,domain->width,
                       (uint64_t *)0x0,0);
  if (ctx_local == (rnndeccontext *)0x0) {
    ctx_local = (rnndeccontext *)calloc(0x18,1);
    asprintf((char **)&ctx_local->varsnum,"%s%#lx%s",ctx->colors->err,addr,ctx->colors->reset);
  }
  return (rnndecaddrinfo *)ctx_local;
}

Assistant:

struct rnndecaddrinfo *rnndec_decodeaddr(struct rnndeccontext *ctx, struct rnndomain *domain, uint64_t addr, int write) {
	struct rnndecaddrinfo *res = trymatch(ctx, domain->subelems, domain->subelemsnum, addr, write, domain->width, 0, 0);
	if (res)
		return res;
	res = calloc (sizeof *res, 1);
	asprintf (&res->name, "%s%#"PRIx64"%s", ctx->colors->err, addr, ctx->colors->reset);
	return res;
}